

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O0

void __thiscall
Assimp::ImproveCacheLocalityProcess::Execute(ImproveCacheLocalityProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this_00;
  float local_1d8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  ai_real local_2c;
  uint local_28;
  float res;
  uint a;
  uint numm;
  uint numf;
  float out;
  aiScene *pScene_local;
  ImproveCacheLocalityProcess *this_local;
  
  _numf = pScene;
  pScene_local = (aiScene *)this;
  if (pScene->mNumMeshes == 0) {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"ImproveCacheLocalityProcess skipped; there are no meshes");
  }
  else {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"ImproveCacheLocalityProcess begin");
    numm = 0;
    a = 0;
    res = 0.0;
    for (local_28 = 0; local_28 < _numf->mNumMeshes; local_28 = local_28 + 1) {
      local_2c = ProcessMesh(this,_numf->mMeshes[local_28],local_28);
      if ((local_2c != 0.0) || (NAN(local_2c))) {
        a = _numf->mMeshes[local_28]->mNumFaces + a;
        numm = (uint)(local_2c + (float)numm);
        res = (float)((int)res + 1);
      }
    }
    bVar1 = DefaultLogger::isNullLogger();
    if (!bVar1) {
      if (a != 0) {
        pLVar2 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[20]>(&local_1c8,(char (*) [20])"Cache relevant are ");
        pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_1c8,(uint *)&res);
        pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar3,(char (*) [10])" meshes (");
        pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar3,&a);
        pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar3,(char (*) [33])" faces). Average output ACMR is ");
        local_1d8[0] = (float)numm / (float)a;
        this_00 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar3,local_1d8);
        Formatter::basic_formatter::operator_cast_to_string(&local_50,this_00);
        Logger::info(pLVar2,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1c8);
      }
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"ImproveCacheLocalityProcess finished. ");
    }
  }
  return;
}

Assistant:

void ImproveCacheLocalityProcess::Execute( aiScene* pScene) {
    if (!pScene->mNumMeshes) {
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess skipped; there are no meshes");
        return;
    }

    ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess begin");

    float out = 0.f;
    unsigned int numf = 0, numm = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ){
        const float res = ProcessMesh( pScene->mMeshes[a],a);
        if (res) {
            numf += pScene->mMeshes[a]->mNumFaces;
            out  += res;
            ++numm;
        }
    }
    if (!DefaultLogger::isNullLogger()) {
        if (numf > 0) {
            ASSIMP_LOG_INFO_F("Cache relevant are ", numm, " meshes (", numf, " faces). Average output ACMR is ", out / numf);
        }
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess finished. ");
    }
}